

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O3

MatrixXd * __thiscall
lf::uscalfe::FeLagrangeO2Tria<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,FeLagrangeO2Tria<double> *this)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> *pCVar4;
  long lVar5;
  Index index;
  ulong uVar6;
  ActualDstType actualDst;
  long lVar7;
  Matrix<double,_2,_6,_0,_2,_6> nodes;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> local_98;
  Matrix<double,_2,_6,_0,_2,_6> local_78;
  
  local_98.m_xpr = &local_78;
  local_98.m_row = 0;
  local_98.m_col = 1;
  local_98.m_currentBlockRows = 1;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>.m_storage.m_data.array[0] =
       0.0;
  local_a0 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (&local_98,&local_a0);
  local_a8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar4,&local_a8);
  local_b0 = 0.5;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar4,&local_b0);
  local_b8 = 0.5;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar4,&local_b8);
  local_c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar4,&local_c0);
  local_c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar4,&local_c8);
  local_d0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar4,&local_d0);
  local_d8 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar4,&local_d8);
  local_e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar4,&local_e0);
  local_e8 = 0.5;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar4,&local_e8);
  local_f0 = 0.5;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_(pCVar4,&local_f0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::finished(&local_98);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,0xc,2,6);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,2,6,0,2,6>,double,double>
            (__return_storage_ptr__,&local_78,(assign_op<double,_double> *)&local_98);
  pdVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  lVar5 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_cols *
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  uVar6 = lVar5 - (lVar5 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar5) {
    lVar7 = 0;
    do {
      dVar3 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>.m_storage.m_data
              .array[lVar7 + 1];
      pdVar1 = pdVar2 + lVar7;
      *pdVar1 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>.m_storage.
                m_data.array[lVar7];
      pdVar1[1] = dVar3;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)uVar6);
  }
  if ((long)uVar6 < lVar5) {
    do {
      pdVar2[uVar6] =
           local_78.super_PlainObjectBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>.m_storage.m_data.
           array[uVar6];
      uVar6 = uVar6 + 1;
    } while (lVar5 - uVar6 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    // clang-format off
    Eigen::Matrix<double, 2,6> nodes;
    // Reference coordinates of evaluation nodes in the columns of a 2 x 6 - matrix. 
    nodes << 0.0, 1.0, 0.0,  0.5, 0.5, 0.0,
             0.0, 0.0, 1.0,  0.0, 0.5, 0.5;
    // clang-format on
    return nodes;
  }